

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_manager.cpp
# Opt level: O3

void __thiscall
duckdb::DependencyManager::VerifyCommitDrop
          (DependencyManager *this,CatalogTransaction transaction,transaction_t start_time,
          CatalogEntry *object)

{
  CatalogType CVar1;
  CatalogEntryInfo info;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  transaction_t local_78;
  CatalogEntryInfo local_70;
  
  if (object->internal == false) {
    CVar1 = object->type;
    if (((CVar1 != DATABASE_ENTRY) && (CVar1 != RENAMED_ENTRY)) && (CVar1 != DEPENDENCY_ENTRY)) {
      local_78 = start_time;
      GetLookupProperties(&local_70,object);
      local_80 = ::std::
                 _Function_handler<void_(duckdb::DependencyEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/dependency_manager.cpp:474:36)>
                 ::_M_invoke;
      local_88 = ::std::
                 _Function_handler<void_(duckdb::DependencyEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/dependency_manager.cpp:474:36)>
                 ::_M_manager;
      local_98._M_unused._M_object = &local_78;
      local_98._8_8_ = object;
      ScanSetInternal(this,transaction,&local_70,false,(dependency_callback_t *)&local_98);
      if (local_88 != (code *)0x0) {
        (*local_88)(&local_98,&local_98,__destroy_functor);
      }
      local_80 = ::std::
                 _Function_handler<void_(duckdb::DependencyEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/dependency_manager.cpp:488:34)>
                 ::_M_invoke;
      local_88 = ::std::
                 _Function_handler<void_(duckdb::DependencyEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/dependency_manager.cpp:488:34)>
                 ::_M_manager;
      local_98._M_unused._M_object = &local_78;
      local_98._8_8_ = object;
      ScanSetInternal(this,transaction,&local_70,true,(dependency_callback_t *)&local_98);
      if (local_88 != (code *)0x0) {
        (*local_88)(&local_98,&local_98,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.name._M_dataplus._M_p != &local_70.name.field_2) {
        operator_delete(local_70.name._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.schema._M_dataplus._M_p != &local_70.schema.field_2) {
        operator_delete(local_70.schema._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

void DependencyManager::VerifyCommitDrop(CatalogTransaction transaction, transaction_t start_time,
                                         CatalogEntry &object) {
	if (IsSystemEntry(object)) {
		return;
	}
	auto info = GetLookupProperties(object);
	ScanDependents(transaction, info, [&](DependencyEntry &dep) {
		auto dep_committed_at = dep.timestamp.load();
		if (dep_committed_at > start_time) {
			// In the event of a CASCADE, the dependency drop has not committed yet
			// so we would be halted by the existence of a dependency we are already dropping unless we check the
			// timestamp
			//
			// Which differentiates between objects that we were already aware of (and will subsequently be dropped) and
			// objects that were introduced inbetween, which should cause this error:
			throw DependencyException(
			    "Could not commit DROP of \"%s\" because a dependency was created after the transaction started",
			    object.name);
		}
	});
	ScanSubjects(transaction, info, [&](DependencyEntry &dep) {
		auto dep_committed_at = dep.timestamp.load();
		if (!dep.Dependent().flags.IsOwnedBy()) {
			return;
		}
		D_ASSERT(dep.Subject().flags.IsOwnership());
		if (dep_committed_at > start_time) {
			// Same as above, objects that are owned by the object that is being dropped will be dropped as part of this
			// transaction. Only objects that were introduced by other transactions, that this transaction could not
			// see, should cause this error:
			throw DependencyException(
			    "Could not commit DROP of \"%s\" because a dependency was created after the transaction started",
			    object.name);
		}
	});
}